

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int session_send_disposition(LINK_ENDPOINT_HANDLE link_endpoint,DISPOSITION_HANDLE disposition)

{
  int iVar1;
  AMQP_VALUE performative;
  AMQP_VALUE disposition_performative_value;
  int result;
  DISPOSITION_HANDLE disposition_local;
  LINK_ENDPOINT_HANDLE link_endpoint_local;
  
  if ((link_endpoint == (LINK_ENDPOINT_HANDLE)0x0) || (disposition == (DISPOSITION_HANDLE)0x0)) {
    disposition_performative_value._4_4_ = 0x560;
  }
  else {
    performative = amqpvalue_create_disposition(disposition);
    if (performative == (AMQP_VALUE)0x0) {
      disposition_performative_value._4_4_ = 0x567;
    }
    else {
      iVar1 = encode_frame(link_endpoint,performative,(PAYLOAD *)0x0,0);
      if (iVar1 == 0) {
        disposition_performative_value._4_4_ = 0;
      }
      else {
        disposition_performative_value._4_4_ = 0x56d;
      }
      amqpvalue_destroy(performative);
    }
  }
  return disposition_performative_value._4_4_;
}

Assistant:

int session_send_disposition(LINK_ENDPOINT_HANDLE link_endpoint, DISPOSITION_HANDLE disposition)
{
    int result;

    if ((link_endpoint == NULL) ||
        (disposition == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE disposition_performative_value = amqpvalue_create_disposition(disposition);
        if (disposition_performative_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (encode_frame(link_endpoint, disposition_performative_value, NULL, 0) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(disposition_performative_value);
        }
    }

    return result;
}